

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::BuildVertexIndicesImpl
          (RenderSceneConverter *this,RenderMesh *mesh)

{
  value_type vVar1;
  uint uVar2;
  value_type vVar3;
  value_type vVar4;
  bool bVar5;
  size_type sVar6;
  size_t sVar7;
  ostream *poVar8;
  reference ppVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar10;
  const_reference pvVar11;
  float3 *pfVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  size_type sVar16;
  iterator __first;
  reference puVar17;
  ulong uVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  size_type sVar22;
  mapped_type *pmVar23;
  reference ppVar24;
  size_type sVar25;
  array<float,_3UL> *paVar26;
  mapped_type *pmVar27;
  array<float,_2UL> *paVar28;
  float *pfVar29;
  long lVar30;
  ulong uVar31;
  unsigned_long *in_R8;
  uchar *local_2608;
  float *local_2600;
  float3 *local_25f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_25f0;
  key_type local_25e0 [4];
  string local_25d0;
  ostringstream local_25b0 [8];
  ostringstream ss_e_20;
  string local_2438;
  ostringstream local_2418 [8];
  ostringstream ss_e_19;
  ulong local_22a0;
  size_t k_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dstPointIndices;
  ostringstream local_2270 [8];
  ostringstream ss_e_18;
  value_type local_20f4;
  ulong uStack_20f0;
  uint32_t orgPointIdx;
  size_t i_4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmpPointIndices;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> tmpNormalOffsets;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> tmpPointOffsets;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>
  *target;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
  *__range3;
  ulong local_2078;
  size_t i_3;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  pointIdxRemap;
  size_t k_1;
  ostringstream local_2010 [8];
  ostringstream ss_e_17;
  ulong local_1e98;
  size_t k;
  ostringstream local_1e70 [8];
  ostringstream ss_e_16;
  ulong local_1cf8;
  size_t i_2;
  undefined1 local_1ce8 [8];
  vector<float,_std::allocator<float>_> tmp_weights;
  undefined1 local_1cc8 [8];
  vector<int,_std::allocator<int>_> tmp_indices;
  undefined1 local_1ca8 [4];
  uint32_t elementSize;
  ostringstream local_1c88 [8];
  ostringstream ss_e_15;
  string local_1b10;
  ostringstream local_1af0 [8];
  ostringstream ss_e_14;
  ulong local_1978;
  size_t i_1;
  undefined1 local_1968 [8];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> tmp_points;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1940;
  uint local_1934;
  undefined1 local_1930 [4];
  uint32_t numPoints;
  ostringstream local_1910 [8];
  ostringstream ss_e_13;
  undefined1 local_1798 [8];
  DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> vertex_output;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_point_indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_indices;
  allocator local_1681;
  string local_1680 [32];
  string local_1660;
  ostringstream local_1640 [8];
  ostringstream ss_e_12;
  undefined1 local_14c8 [8];
  size_t fvi;
  size_t i;
  float *opacities_ptr;
  float3 *colors_ptr;
  float3 *normals_ptr;
  ostringstream local_1480 [8];
  ostringstream ss_e_11;
  string local_1308;
  ostringstream local_12e8 [8];
  ostringstream ss_e_10;
  string local_1170;
  ostringstream local_1150 [8];
  ostringstream ss_e_9;
  string local_fd8;
  ostringstream local_fb8 [8];
  ostringstream ss_e_8;
  string local_e40;
  ostringstream local_e20 [8];
  ostringstream ss_e_7;
  string local_ca8;
  ostringstream local_c88 [8];
  ostringstream ss_e_6;
  string local_b10;
  ostringstream local_af0 [8];
  ostringstream ss_e_5;
  string local_978;
  ostringstream local_958 [8];
  ostringstream ss_e_4;
  uchar *local_7e0;
  float3 *binormals_ptr;
  float3 *tangents_ptr;
  ostringstream local_7b0 [8];
  ostringstream ss_e_3;
  string local_638;
  ostringstream local_618 [8];
  ostringstream ss_e_2;
  pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute> *it;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
  *__range2;
  float2 *texcoord1_ptr;
  float2 *texcoord0_ptr;
  ostringstream local_450 [8];
  ostringstream ss_e_1;
  string local_2d0;
  ostringstream local_2b0 [8];
  ostringstream ss_e;
  value_type_conflict local_134;
  value_type local_130;
  value_type local_124;
  value_type local_118;
  value_type local_10c;
  value_type local_100;
  value_type local_f8;
  size_type local_f0;
  size_t num_fvs;
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData> vertex_input;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *fvIndices;
  RenderMesh *mesh_local;
  RenderSceneConverter *this_local;
  
  sVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&mesh->triangulatedFaceVertexIndices);
  if (sVar6 == 0) {
    local_25f0 = &mesh->usdFaceVertexIndices;
  }
  else {
    local_25f0 = &mesh->triangulatedFaceVertexIndices;
  }
  vertex_input.opacities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_25f0;
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData>::DefaultVertexInput
            ((DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData> *)&num_fvs);
  local_f0 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        vertex_input.opacities.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&num_fvs,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             vertex_input.opacities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  local_f8._M_elems[0] = 0.0;
  local_f8._M_elems[1] = 0.0;
  ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::assign
            ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
             &vertex_input.normals.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_f0,&local_f8);
  local_100._M_elems[0] = 0.0;
  local_100._M_elems[1] = 0.0;
  ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::assign
            ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
             &vertex_input.uv0s.
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_f0,&local_100);
  local_10c._M_elems[0] = 0.0;
  local_10c._M_elems[1] = 0.0;
  local_10c._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::assign
            ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
             &vertex_input.point_indices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_f0,&local_10c);
  local_118._M_elems[0] = 0.0;
  local_118._M_elems[1] = 0.0;
  local_118._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::assign
            ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
             &vertex_input.uv1s.
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_f0,&local_118);
  local_124._M_elems[0] = 0.0;
  local_124._M_elems[1] = 0.0;
  local_124._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::assign
            ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
             &vertex_input.tangents.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_f0,&local_124);
  local_130._M_elems[0] = 0.0;
  local_130._M_elems[1] = 0.0;
  local_130._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::assign
            ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
             &vertex_input.binormals.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_f0,&local_130);
  local_134 = 0.0;
  ::std::vector<float,_std::allocator<float>_>::assign
            ((vector<float,_std::allocator<float>_> *)
             &vertex_input.colors.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_f0,&local_134);
  sVar7 = VertexAttribute::vertex_count(&mesh->normals);
  if (sVar7 != 0) {
    bVar5 = VertexAttribute::is_facevarying(&mesh->normals);
    if (!bVar5) {
      ::std::__cxx11::ostringstream::ostringstream(local_2b0);
      poVar8 = ::std::operator<<((ostream *)local_2b0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x9ca);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_2b0,
                                 "Internal error. normals must be \'facevarying\' variability.");
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_2d0);
      ::std::__cxx11::string::~string((string *)&local_2d0);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_2b0);
      goto LAB_004a99c6;
    }
    sVar7 = VertexAttribute::vertex_count(&mesh->normals);
    if (sVar7 != local_f0) {
      ::std::__cxx11::ostringstream::ostringstream(local_450);
      poVar8 = ::std::operator<<((ostream *)local_450,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x9cf);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_450,
                                 "Internal error. The number of normal items does not match with the number of facevarying items."
                                );
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&texcoord0_ptr);
      ::std::__cxx11::string::~string((string *)&texcoord0_ptr);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_450);
      goto LAB_004a99c6;
    }
  }
  texcoord1_ptr = (float2 *)0x0;
  __range2 = (unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
              *)0x0;
  __end2 = ::std::
           unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
           ::begin(&mesh->texcoords);
  it = (pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute> *)
       ::std::
       unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
       ::end(&mesh->texcoords);
  while (bVar5 = ::std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_false>
                            ,(_Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_false>
                              *)&it), bVar5) {
    ppVar9 = ::std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_false,_false>
             ::operator*(&__end2);
    sVar7 = VertexAttribute::vertex_count(&ppVar9->second);
    if (sVar7 != 0) {
      bVar5 = VertexAttribute::is_facevarying(&ppVar9->second);
      if (!bVar5) {
        ::std::__cxx11::ostringstream::ostringstream(local_618);
        poVar8 = ::std::operator<<((ostream *)local_618,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x9da);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_618,
                                   "Internal error. texcoords must be \'facevarying\' variability.")
        ;
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_638);
        ::std::__cxx11::string::~string((string *)&local_638);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_618);
        goto LAB_004a99c6;
      }
      sVar7 = VertexAttribute::vertex_count(&ppVar9->second);
      if (sVar7 != local_f0) {
        ::std::__cxx11::ostringstream::ostringstream(local_7b0);
        poVar8 = ::std::operator<<((ostream *)local_7b0,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x9df);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_7b0,
                                   "Internal error. The number of texcoord items does not match with the number of facevarying items."
                                  );
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&tangents_ptr);
        ::std::__cxx11::string::~string((string *)&tangents_ptr);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_7b0);
        goto LAB_004a99c6;
      }
      if (ppVar9->first == 0) {
        pvVar10 = VertexAttribute::get_data(&ppVar9->second);
        texcoord1_ptr =
             (float2 *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar10);
      }
      else if (ppVar9->first == 1) {
        pvVar10 = VertexAttribute::get_data(&ppVar9->second);
        __range2 = (unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
                    *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar10);
      }
    }
    ::std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_false,_false>::
    operator++(&__end2);
  }
  binormals_ptr = (float3 *)0x0;
  local_7e0 = (uchar *)0x0;
  if (texcoord1_ptr != (float2 *)0x0) {
    sVar7 = VertexAttribute::vertex_count(&mesh->tangents);
    if (sVar7 != 0) {
      bVar5 = VertexAttribute::is_facevarying(&mesh->tangents);
      if (!bVar5) {
        ::std::__cxx11::ostringstream::ostringstream(local_958);
        poVar8 = ::std::operator<<((ostream *)local_958,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x9f5);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_958,
                                   "Internal error. tangents must be \'facevarying\' variability.");
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_978);
        ::std::__cxx11::string::~string((string *)&local_978);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_958);
        goto LAB_004a99c6;
      }
      sVar7 = VertexAttribute::vertex_count(&mesh->tangents);
      if (sVar7 != local_f0) {
        ::std::__cxx11::ostringstream::ostringstream(local_af0);
        poVar8 = ::std::operator<<((ostream *)local_af0,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x9fa);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_af0,
                                   "Internal error. The number of tangents items does not match with the number of facevarying items."
                                  );
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_b10);
        ::std::__cxx11::string::~string((string *)&local_b10);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_af0);
        goto LAB_004a99c6;
      }
      pvVar10 = VertexAttribute::get_data(&mesh->tangents);
      binormals_ptr =
           (float3 *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar10);
    }
    sVar7 = VertexAttribute::vertex_count(&mesh->binormals);
    if (sVar7 != 0) {
      bVar5 = VertexAttribute::is_facevarying(&mesh->binormals);
      if (!bVar5) {
        ::std::__cxx11::ostringstream::ostringstream(local_c88);
        poVar8 = ::std::operator<<((ostream *)local_c88,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa04);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_c88,
                                   "Internal error. binormals must be \'facevarying\' variability.")
        ;
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_ca8);
        ::std::__cxx11::string::~string((string *)&local_ca8);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_c88);
        goto LAB_004a99c6;
      }
      sVar7 = VertexAttribute::vertex_count(&mesh->binormals);
      if (sVar7 != local_f0) {
        ::std::__cxx11::ostringstream::ostringstream(local_e20);
        poVar8 = ::std::operator<<((ostream *)local_e20,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa09);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_e20,
                                   "Internal error. The number of binormals items does not match with the number of facevarying items."
                                  );
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_e40);
        ::std::__cxx11::string::~string((string *)&local_e40);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_e20);
        goto LAB_004a99c6;
      }
      pvVar10 = VertexAttribute::get_data(&mesh->binormals);
      local_7e0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar10);
    }
  }
  sVar7 = VertexAttribute::vertex_count(&mesh->vertex_colors);
  if (sVar7 != 0) {
    bVar5 = VertexAttribute::is_facevarying(&mesh->vertex_colors);
    if (!bVar5) {
      ::std::__cxx11::ostringstream::ostringstream(local_fb8);
      poVar8 = ::std::operator<<((ostream *)local_fb8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa13);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_fb8,
                                 "Internal error. vertex_colors must be \'facevarying\' variability."
                                );
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_fd8);
      ::std::__cxx11::string::~string((string *)&local_fd8);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_fb8);
      goto LAB_004a99c6;
    }
    sVar7 = VertexAttribute::vertex_count(&mesh->vertex_colors);
    if (sVar7 != local_f0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1150);
      poVar8 = ::std::operator<<((ostream *)local_1150,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa18);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_1150,
                                 "Internal error. The number of vertex_color items does not match with the number of facevarying items."
                                );
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_1170);
      ::std::__cxx11::string::~string((string *)&local_1170);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1150);
      goto LAB_004a99c6;
    }
  }
  sVar7 = VertexAttribute::vertex_count(&mesh->vertex_opacities);
  if (sVar7 != 0) {
    bVar5 = VertexAttribute::is_facevarying(&mesh->vertex_opacities);
    if (!bVar5) {
      ::std::__cxx11::ostringstream::ostringstream(local_12e8);
      poVar8 = ::std::operator<<((ostream *)local_12e8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa20);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_12e8,
                                 "Internal error. vertex_opacities must be \'facevarying\' variability."
                                );
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_1308);
      ::std::__cxx11::string::~string((string *)&local_1308);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_12e8);
      goto LAB_004a99c6;
    }
    sVar7 = VertexAttribute::vertex_count(&mesh->vertex_colors);
    if (sVar7 != local_f0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1480);
      poVar8 = ::std::operator<<((ostream *)local_1480,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa25);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_1480,
                                 "Internal error. The number of vertex_opacity items does not match with the number of facevarying items."
                                );
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&normals_ptr);
      ::std::__cxx11::string::~string((string *)&normals_ptr);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1480);
      goto LAB_004a99c6;
    }
  }
  sVar7 = VertexAttribute::vertex_count(&mesh->normals);
  if (sVar7 == 0) {
    local_25f8 = (float3 *)0x0;
  }
  else {
    pvVar10 = VertexAttribute::get_data(&mesh->normals);
    local_25f8 = (float3 *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar10);
  }
  colors_ptr = local_25f8;
  sVar7 = VertexAttribute::vertex_count(&mesh->vertex_colors);
  if (sVar7 == 0) {
    local_2600 = (float *)0x0;
  }
  else {
    pvVar10 = VertexAttribute::get_data(&mesh->vertex_colors);
    local_2600 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     pvVar10);
  }
  opacities_ptr = local_2600;
  sVar7 = VertexAttribute::vertex_count(&mesh->vertex_opacities);
  if (sVar7 == 0) {
    local_2608 = (uchar *)0x0;
  }
  else {
    pvVar10 = VertexAttribute::get_data(&mesh->vertex_opacities);
    local_2608 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar10);
  }
  i = (size_t)local_2608;
  for (fvi = 0; fvi < local_f0; fvi = fvi + 1) {
    pvVar11 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         vertex_input.opacities.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,fvi);
    local_14c8 = (undefined1  [8])(ulong)*pvVar11;
    if (local_f0 <= (ulong)local_14c8) {
      ::std::__cxx11::ostringstream::ostringstream(local_1640);
      poVar8 = ::std::operator<<((ostream *)local_1640,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa3d);
      ::std::operator<<(poVar8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1680,"Invalid faceVertexIndex {}. Must be less than {}",&local_1681);
      fmt::format<unsigned_long,unsigned_long>
                (&local_1660,(fmt *)local_1680,(string *)local_14c8,&local_f0,in_R8);
      poVar8 = ::std::operator<<((ostream *)local_1640,(string *)&local_1660);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::~string((string *)&local_1660);
      ::std::__cxx11::string::~string(local_1680);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1681);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &out_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &out_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1640);
      goto LAB_004a99c6;
    }
    if (colors_ptr != (float3 *)0x0) {
      pfVar12 = colors_ptr + fvi;
      pvVar13 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)&vertex_input.point_indices.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,fvi);
      *(undefined8 *)pvVar13->_M_elems = *(undefined8 *)pfVar12->_M_elems;
      pvVar13->_M_elems[2] = pfVar12->_M_elems[2];
    }
    sVar7 = fvi;
    if (texcoord1_ptr != (float2 *)0x0) {
      pvVar14 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                operator[]((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            *)&vertex_input.normals.
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,fvi);
      *(undefined8 *)pvVar14->_M_elems = *(undefined8 *)texcoord1_ptr[sVar7]._M_elems;
    }
    sVar7 = fvi;
    if (__range2 !=
        (unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
         *)0x0) {
      pvVar14 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                operator[]((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            *)&vertex_input.uv0s.
                               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,fvi);
      *(__buckets_ptr *)pvVar14->_M_elems = (&(__range2->_M_h)._M_buckets)[sVar7];
    }
    if (binormals_ptr != (float3 *)0x0) {
      pfVar12 = binormals_ptr + fvi;
      pvVar13 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)&vertex_input.uv1s.
                               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,fvi);
      *(undefined8 *)pvVar13->_M_elems = *(undefined8 *)pfVar12->_M_elems;
      pvVar13->_M_elems[2] = pfVar12->_M_elems[2];
    }
    if (local_7e0 != (uchar *)0x0) {
      lVar30 = fvi * 0xc;
      pvVar13 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)&vertex_input.tangents.
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,fvi);
      *(undefined8 *)pvVar13->_M_elems = *(undefined8 *)(local_7e0 + lVar30);
      pvVar13->_M_elems[2] = *(float *)(local_7e0 + lVar30 + 8);
    }
    if (opacities_ptr != (float *)0x0) {
      pfVar29 = opacities_ptr + fvi * 3;
      pvVar13 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)&vertex_input.binormals.
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,fvi);
      *(undefined8 *)pvVar13->_M_elems = *(undefined8 *)pfVar29;
      pvVar13->_M_elems[2] = pfVar29[2];
    }
    if (i != 0) {
      vVar1 = *(value_type *)(i + fvi * 4);
      pvVar15 = ::std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)
                           &vertex_input.colors.
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,fvi);
      *pvVar15 = vVar1;
    }
  }
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &out_point_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &vertex_output.opacities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData>::DefaultVertexOutput
            ((DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> *)local_1798);
  BuildIndices<tinyusdz::tydra::DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData>,tinyusdz::tydra::DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData>,tinyusdz::tydra::DefaultPackedVertexData,tinyusdz::tydra::DefaultPackedVertexDataHasher,tinyusdz::tydra::DefaultPackedVertexDataEqual>
            ((DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData> *)&num_fvs,
             (DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> *)local_1798,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &out_point_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &vertex_output.opacities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &out_point_indices.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  sVar16 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &vertex_output.opacities.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar6 == sVar16) {
    bVar5 = RenderMesh::is_triangulated(mesh);
    if (bVar5) {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&mesh->triangulatedFaceVertexIndices,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &out_point_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&mesh->usdFaceVertexIndices,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &out_point_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    __first = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &out_point_indices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    tmp_points.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &out_point_indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1940 = ::std::
                 max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                           (__first._M_current,
                            (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             )tmp_points.
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar17 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&local_1940);
    local_1934 = *puVar17 + 1;
    uVar18 = (ulong)local_1934;
    ::std::allocator<std::array<float,_3UL>_>::allocator
              ((allocator<std::array<float,_3UL>_> *)((long)&i_1 + 7));
    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
              ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
               local_1968,uVar18,(allocator_type *)((long)&i_1 + 7));
    ::std::allocator<std::array<float,_3UL>_>::~allocator
              ((allocator<std::array<float,_3UL>_> *)((long)&i_1 + 7));
    for (local_1978 = 0;
        sVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &vertex_output.opacities.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), local_1978 < sVar6;
        local_1978 = local_1978 + 1) {
      pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &vertex_output.opacities.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_1978);
      uVar2 = *pvVar19;
      sVar6 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::size
                        (&mesh->points);
      if (sVar6 <= uVar2) {
        ::std::__cxx11::ostringstream::ostringstream(local_1af0);
        poVar8 = ::std::operator<<((ostream *)local_1af0,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa7e);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_1af0,"Internal error. point index out-of-range."
                                  );
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_1b10);
        ::std::__cxx11::string::~string((string *)&local_1b10);
        this_local._7_1_ = 0;
        bVar5 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_1af0);
        goto LAB_004a8863;
      }
      pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &vertex_output.opacities.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_1978);
      pvVar13 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                operator[](&mesh->points,(ulong)*pvVar19);
      pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &out_point_indices.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_1978);
      pvVar20 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)local_1968,(ulong)*pvVar19);
      *(undefined8 *)pvVar20->_M_elems = *(undefined8 *)pvVar13->_M_elems;
      pvVar20->_M_elems[2] = pvVar13->_M_elems[2];
    }
    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::swap
              (&mesh->points,
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
               local_1968);
    bVar5 = false;
LAB_004a8863:
    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
              ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
               local_1968);
    if (!bVar5) {
      sVar6 = ::std::vector<int,_std::allocator<int>_>::size
                        (&(mesh->joint_and_weights).jointIndices);
      if (sVar6 == 0) {
LAB_004a8f5a:
        sVar22 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
                 ::size(&mesh->targets);
        if (sVar22 != 0) {
          ::std::
          unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::unordered_map((unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                           *)&i_3);
          for (local_2078 = 0; uVar18 = local_2078,
              sVar7 = DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData>::size
                                ((DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> *)
                                 local_1798), uVar18 < sVar7; local_2078 = local_2078 + 1) {
            pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1798,
                                 local_2078);
            pmVar23 = ::std::
                      unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator[]((unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                    *)&i_3,pvVar19);
            __range3._4_4_ = (undefined4)local_2078;
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (pmVar23,(value_type_conflict3 *)((long)&__range3 + 4));
          }
          __end3 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
                   ::begin(&mesh->targets);
          target = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>
                    *)::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
                      ::end(&mesh->targets);
          while (bVar5 = ::std::operator!=(&__end3,(_Self *)&target), bVar5) {
            ppVar24 = ::std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>
                      ::operator*(&__end3);
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &tmpNormalOffsets.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &tmpPointIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4);
            for (uStack_20f0 = 0; uVar18 = uStack_20f0,
                sVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                  (&(ppVar24->second).pointIndices), uVar18 < sVar6;
                uStack_20f0 = uStack_20f0 + 1) {
              pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (&(ppVar24->second).pointIndices,uStack_20f0);
              local_20f4 = *pvVar19;
              sVar25 = ::std::
                       unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                       ::count((unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&i_3,&local_20f4);
              if (sVar25 == 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_2270);
                poVar8 = ::std::operator<<((ostream *)local_2270,"[error]");
                poVar8 = ::std::operator<<(poVar8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                          );
                poVar8 = ::std::operator<<(poVar8,":");
                poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
                poVar8 = ::std::operator<<(poVar8,"():");
                poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xabf);
                ::std::operator<<(poVar8," ");
                poVar8 = ::std::operator<<((ostream *)local_2270,"Invalid pointIndices value.");
                ::std::operator<<(poVar8,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&dstPointIndices);
                ::std::__cxx11::string::~string((string *)&dstPointIndices);
                this_local._7_1_ = 0;
                bVar5 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_2270);
                goto LAB_004a95d9;
              }
              pmVar23 = ::std::
                        unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                        ::at((unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                              *)&i_3,&local_20f4);
              for (local_22a0 = 0;
                  sVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pmVar23),
                  local_22a0 < sVar6; local_22a0 = local_22a0 + 1) {
                sVar6 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        size(&(ppVar24->second).pointOffsets);
                uVar18 = uStack_20f0;
                if (sVar6 != 0) {
                  sVar6 = ::std::
                          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                          size(&(ppVar24->second).pointOffsets);
                  if (sVar6 <= uVar18) {
                    ::std::__cxx11::ostringstream::ostringstream(local_2418);
                    poVar8 = ::std::operator<<((ostream *)local_2418,"[error]");
                    poVar8 = ::std::operator<<(poVar8,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                              );
                    poVar8 = ::std::operator<<(poVar8,":");
                    poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
                    poVar8 = ::std::operator<<(poVar8,"():");
                    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xac6);
                    ::std::operator<<(poVar8," ");
                    poVar8 = ::std::operator<<((ostream *)local_2418,"Invalid pointOffsets.size.");
                    ::std::operator<<(poVar8,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_2438);
                    ::std::__cxx11::string::~string((string *)&local_2438);
                    this_local._7_1_ = 0;
                    bVar5 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_2418);
                    goto LAB_004a95d9;
                  }
                  pvVar13 = ::std::
                            vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ::operator[](&(ppVar24->second).pointOffsets,uStack_20f0);
                  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  push_back((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)&tmpNormalOffsets.
                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar13);
                }
                sVar6 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        size(&(ppVar24->second).normalOffsets);
                uVar18 = uStack_20f0;
                if (sVar6 != 0) {
                  sVar6 = ::std::
                          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                          size(&(ppVar24->second).normalOffsets);
                  if (sVar6 <= uVar18) {
                    ::std::__cxx11::ostringstream::ostringstream(local_25b0);
                    poVar8 = ::std::operator<<((ostream *)local_25b0,"[error]");
                    poVar8 = ::std::operator<<(poVar8,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                              );
                    poVar8 = ::std::operator<<(poVar8,":");
                    poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
                    poVar8 = ::std::operator<<(poVar8,"():");
                    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xacc);
                    ::std::operator<<(poVar8," ");
                    poVar8 = ::std::operator<<((ostream *)local_25b0,"Invalid normalOffsets.size.");
                    ::std::operator<<(poVar8,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_25d0);
                    ::std::__cxx11::string::~string((string *)&local_25d0);
                    this_local._7_1_ = 0;
                    bVar5 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_25b0);
                    goto LAB_004a95d9;
                  }
                  pvVar13 = ::std::
                            vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ::operator[](&(ppVar24->second).normalOffsets,uStack_20f0);
                  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  push_back((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)&tmpPointIndices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar13);
                }
                pvVar11 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (pmVar23,local_22a0);
                ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4,pvVar11);
              }
            }
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
                      (&(ppVar24->second).pointIndices,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4);
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::swap
                      (&(ppVar24->second).pointOffsets,
                       (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &tmpNormalOffsets.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::swap
                      (&(ppVar24->second).normalOffsets,
                       (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &tmpPointIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            bVar5 = false;
LAB_004a95d9:
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4);
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &tmpPointIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &tmpNormalOffsets.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar5) goto LAB_004a9626;
            ::std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>
            ::operator++(&__end3);
          }
          bVar5 = false;
LAB_004a9626:
          ::std::
          unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::~unordered_map((unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            *)&i_3);
          if (bVar5) goto LAB_004a99a2;
        }
        if (colors_ptr != (float3 *)0x0) {
          paVar26 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ::data((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)&vertex_output.point_indices.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar6 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &vertex_output.point_indices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
          VertexAttribute::set_buffer(&mesh->normals,(uint8_t *)paVar26,sVar6 * 0xc);
          (mesh->normals).variability = Vertex;
        }
        if (texcoord1_ptr != (float2 *)0x0) {
          local_25e0[3] = 0;
          pmVar27 = ::std::
                    unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
                    ::operator[](&mesh->texcoords,local_25e0 + 3);
          paVar28 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ::data((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            *)&vertex_output.normals.
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar6 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                  size((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       &vertex_output.normals.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          VertexAttribute::set_buffer(pmVar27,(uint8_t *)paVar28,sVar6 << 3);
          local_25e0[2] = 0;
          pmVar27 = ::std::
                    unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
                    ::operator[](&mesh->texcoords,local_25e0 + 2);
          pmVar27->variability = Vertex;
        }
        if (__range2 !=
            (unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
             *)0x0) {
          local_25e0[1] = 1;
          pmVar27 = ::std::
                    unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
                    ::operator[](&mesh->texcoords,local_25e0 + 1);
          paVar28 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ::data((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            *)&vertex_output.uv0s.
                               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar6 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                  size((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       &vertex_output.uv0s.
                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          VertexAttribute::set_buffer(pmVar27,(uint8_t *)paVar28,sVar6 << 3);
          local_25e0[0] = 1;
          pmVar27 = ::std::
                    unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
                    ::operator[](&mesh->texcoords,local_25e0);
          pmVar27->variability = Vertex;
        }
        if (binormals_ptr != (float3 *)0x0) {
          paVar26 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ::data((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)&vertex_output.uv1s.
                               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar6 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &vertex_output.uv1s.
                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          VertexAttribute::set_buffer(&mesh->tangents,(uint8_t *)paVar26,sVar6 * 0xc);
          (mesh->tangents).variability = Vertex;
        }
        if (local_7e0 != (uchar *)0x0) {
          paVar26 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ::data((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)&vertex_output.tangents.
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar6 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &vertex_output.tangents.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          VertexAttribute::set_buffer(&mesh->binormals,(uint8_t *)paVar26,sVar6 * 0xc);
          (mesh->binormals).variability = Vertex;
        }
        if (opacities_ptr != (float *)0x0) {
          paVar26 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ::data((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)&vertex_output.binormals.
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar6 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &vertex_output.binormals.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          VertexAttribute::set_buffer(&mesh->vertex_colors,(uint8_t *)paVar26,sVar6 * 0xc);
          (mesh->vertex_colors).variability = Vertex;
        }
        if (i != 0) {
          pfVar29 = ::std::vector<float,_std::allocator<float>_>::data
                              ((vector<float,_std::allocator<float>_> *)
                               &vertex_output.colors.
                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar6 = ::std::vector<float,_std::allocator<float>_>::size
                            ((vector<float,_std::allocator<float>_> *)
                             &vertex_output.colors.
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          VertexAttribute::set_buffer(&mesh->vertex_opacities,(uint8_t *)pfVar29,sVar6 << 2);
          (mesh->vertex_opacities).variability = Vertex;
        }
        this_local._7_1_ = 1;
      }
      else if ((mesh->joint_and_weights).elementSize < 1) {
        ::std::__cxx11::ostringstream::ostringstream(local_1c88);
        poVar8 = ::std::operator<<((ostream *)local_1c88,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa88);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_1c88,
                                   "Internal error. Invalid elementSize in mesh.joint_and_weights.")
        ;
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)local_1ca8);
        ::std::__cxx11::string::~string((string *)local_1ca8);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_1c88);
      }
      else {
        tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = (mesh->joint_and_weights).elementSize;
        uVar18 = (ulong)local_1934;
        uVar31 = (ulong)tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_;
        ::std::allocator<int>::allocator
                  ((allocator<int> *)
                   ((long)&tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        ::std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_1cc8,uVar18 * uVar31,
                   (allocator_type *)
                   ((long)&tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        ::std::allocator<int>::~allocator
                  ((allocator<int> *)
                   ((long)&tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        uVar18 = (ulong)local_1934;
        uVar31 = (ulong)tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_;
        ::std::allocator<float>::allocator((allocator<float> *)((long)&i_2 + 7));
        ::std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_1ce8,uVar18 * uVar31,
                   (allocator_type *)((long)&i_2 + 7));
        ::std::allocator<float>::~allocator((allocator<float> *)((long)&i_2 + 7));
        for (local_1cf8 = 0;
            sVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &vertex_output.opacities.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage),
            uVar2 = tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_, local_1cf8 < sVar6;
            local_1cf8 = local_1cf8 + 1) {
          pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &vertex_output.opacities.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_1cf8);
          vVar3 = *pvVar19;
          sVar6 = ::std::vector<int,_std::allocator<int>_>::size
                            (&(mesh->joint_and_weights).jointIndices);
          if (sVar6 <= uVar2 * vVar3) {
            ::std::__cxx11::ostringstream::ostringstream(local_1e70);
            poVar8 = ::std::operator<<((ostream *)local_1e70,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa91);
            ::std::operator<<(poVar8," ");
            poVar8 = ::std::operator<<((ostream *)local_1e70,
                                       "Internal error. point index exceeds jointIndices.size.");
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&k);
            ::std::__cxx11::string::~string((string *)&k);
            this_local._7_1_ = 0;
            bVar5 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_1e70);
            goto LAB_004a8f30;
          }
          for (local_1e98 = 0;
              uVar2 = tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_,
              local_1e98 <
              tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_; local_1e98 = local_1e98 + 1) {
            uVar18 = (ulong)tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &vertex_output.opacities.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,local_1cf8);
            pvVar21 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                (&(mesh->joint_and_weights).jointIndices,
                                 uVar18 * *pvVar19 + local_1e98);
            vVar4 = *pvVar21;
            uVar18 = (ulong)tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &out_point_indices.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_1cf8);
            pvVar21 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_1cc8,
                                 uVar18 * *pvVar19 + local_1e98);
            *pvVar21 = vVar4;
          }
          pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &vertex_output.opacities.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_1cf8);
          vVar3 = *pvVar19;
          sVar6 = ::std::vector<float,_std::allocator<float>_>::size
                            (&(mesh->joint_and_weights).jointWeights);
          if (sVar6 <= uVar2 * vVar3) {
            ::std::__cxx11::ostringstream::ostringstream(local_2010);
            poVar8 = ::std::operator<<((ostream *)local_2010,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa9c);
            ::std::operator<<(poVar8," ");
            poVar8 = ::std::operator<<((ostream *)local_2010,
                                       "Internal error. point index exceeds jointWeights.size.");
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&k_1);
            ::std::__cxx11::string::~string((string *)&k_1);
            this_local._7_1_ = 0;
            bVar5 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_2010);
            goto LAB_004a8f30;
          }
          for (pointIdxRemap._M_h._M_single_bucket = (__node_base_ptr)0x0;
              pointIdxRemap._M_h._M_single_bucket <
              (__node_base_ptr)
              (ulong)tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
              pointIdxRemap._M_h._M_single_bucket =
                   (__node_base_ptr)((long)&(pointIdxRemap._M_h._M_single_bucket)->_M_nxt + 1)) {
            uVar18 = (ulong)tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &vertex_output.opacities.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,local_1cf8);
            pvVar15 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                (&(mesh->joint_and_weights).jointWeights,
                                 (size_type)
                                 ((long)&(pointIdxRemap._M_h._M_single_bucket)->_M_nxt +
                                 uVar18 * *pvVar19));
            vVar1 = *pvVar15;
            uVar18 = (ulong)tmp_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &out_point_indices.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_1cf8);
            pvVar15 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_1ce8,
                                 (size_type)
                                 ((long)&(pointIdxRemap._M_h._M_single_bucket)->_M_nxt +
                                 uVar18 * *pvVar19));
            *pvVar15 = vVar1;
          }
        }
        ::std::vector<int,_std::allocator<int>_>::swap
                  (&(mesh->joint_and_weights).jointIndices,
                   (vector<int,_std::allocator<int>_> *)local_1cc8);
        ::std::vector<float,_std::allocator<float>_>::swap
                  (&(mesh->joint_and_weights).jointWeights,
                   (vector<float,_std::allocator<float>_> *)local_1ce8);
        bVar5 = false;
LAB_004a8f30:
        ::std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)local_1ce8);
        ::std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_1cc8);
        if (!bVar5) goto LAB_004a8f5a;
      }
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1910);
    poVar8 = ::std::operator<<((ostream *)local_1910,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"BuildVertexIndicesImpl");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xa63);
    ::std::operator<<(poVar8," ");
    poVar8 = ::std::operator<<((ostream *)local_1910,
                               "Internal error. out_indices.size != out_point_indices.");
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)local_1930);
    ::std::__cxx11::string::~string((string *)local_1930);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1910);
  }
LAB_004a99a2:
  DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData>::~DefaultVertexOutput
            ((DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> *)local_1798);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &vertex_output.opacities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &out_point_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_004a99c6:
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData>::~DefaultVertexInput
            ((DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData> *)&num_fvs);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RenderSceneConverter::BuildVertexIndicesImpl(RenderMesh &mesh) {
  //
  // - If mesh is triangulated, use triangulatedFaceVertexIndices, otherwise use
  // faceVertxIndices.
  // - Make vertex attributes 'facevarying' variability
  // - Assign same id for similar(currently identitical) vertex attribute.
  // - Reorder vertex attributes to 'vertex' variability.
  //

  const std::vector<uint32_t> &fvIndices =
      mesh.triangulatedFaceVertexIndices.size()
          ? mesh.triangulatedFaceVertexIndices
          : mesh.usdFaceVertexIndices;

  DefaultVertexInput<DefaultPackedVertexData> vertex_input;

  size_t num_fvs = fvIndices.size();
  vertex_input.point_indices = fvIndices;
  vertex_input.uv0s.assign(num_fvs, {0.0f, 0.0f});
  vertex_input.uv1s.assign(num_fvs, {0.0f, 0.0f});
  vertex_input.normals.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.tangents.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.binormals.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.colors.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.opacities.assign(num_fvs, 0.0f);

  if (mesh.normals.vertex_count()) {
    if (!mesh.normals.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. normals must be 'facevarying' variability.");
    }
    if (mesh.normals.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of normal items does not match with "
          "the number of facevarying items.");
    }
  }

  const value::float2 *texcoord0_ptr = nullptr;
  const value::float2 *texcoord1_ptr = nullptr;

  for (const auto &it : mesh.texcoords) {
    if (it.second.vertex_count() > 0) {
      if (!it.second.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. texcoords must be 'facevarying' variability.");
      }
      if (it.second.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of texcoord items does not match "
            "with the number of facevarying items.");
      }

      if (it.first == 0) {
        texcoord0_ptr = reinterpret_cast<const value::float2 *>(
            it.second.get_data().data());
      } else if (it.first == 1) {
        texcoord1_ptr = reinterpret_cast<const value::float2 *>(
            it.second.get_data().data());
      } else {
        // ignore.
      }
    }
  }

  const value::float3 *tangents_ptr = nullptr;
  const value::float3 *binormals_ptr = nullptr;

  if (texcoord0_ptr) {
    if (mesh.tangents.vertex_count()) {
      if (!mesh.tangents.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. tangents must be 'facevarying' variability.");
      }
      if (mesh.tangents.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of tangents items does not match "
            "with the number of facevarying items.");
      }

      tangents_ptr = reinterpret_cast<const value::float3 *>(
          mesh.tangents.get_data().data());
    }

    if (mesh.binormals.vertex_count()) {
      if (!mesh.binormals.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. binormals must be 'facevarying' variability.");
      }
      if (mesh.binormals.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of binormals items does not match "
            "with the number of facevarying items.");
      }
      binormals_ptr = reinterpret_cast<const value::float3 *>(
          mesh.binormals.get_data().data());
    }
  }

  if (mesh.vertex_colors.vertex_count()) {
    if (!mesh.vertex_colors.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. vertex_colors must be 'facevarying' variability.");
    }
    if (mesh.vertex_colors.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of vertex_color items does not match "
          "with the number of facevarying items.");
    }
  }

  if (mesh.vertex_opacities.vertex_count()) {
    if (!mesh.vertex_opacities.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. vertex_opacities must be 'facevarying' "
          "variability.");
    }
    if (mesh.vertex_colors.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of vertex_opacity items does not match "
          "with the number of facevarying items.");
    }
  }

  const value::float3 *normals_ptr =
      (mesh.normals.vertex_count() > 0)
          ? reinterpret_cast<const value::float3 *>(
                mesh.normals.get_data().data())
          : nullptr;
  const value::float3 *colors_ptr =
      (mesh.vertex_colors.vertex_count() > 0)
          ? reinterpret_cast<const value::float3 *>(
                mesh.vertex_colors.get_data().data())
          : nullptr;
  const float *opacities_ptr =
      (mesh.vertex_opacities.vertex_count() > 0)
          ? reinterpret_cast<const float *>(
                mesh.vertex_opacities.get_data().data())
          : nullptr;

  for (size_t i = 0; i < num_fvs; i++) {
    size_t fvi = fvIndices[i];
    if (fvi >= num_fvs) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Invalid faceVertexIndex {}. Must be less than {}", fvi, num_fvs));
    }

    if (normals_ptr) {
      vertex_input.normals[i] = normals_ptr[i];
    }
    if (texcoord0_ptr) {
      vertex_input.uv0s[i] = texcoord0_ptr[i];
    }
    if (texcoord1_ptr) {
      vertex_input.uv1s[i] = texcoord1_ptr[i];
    }
    if (tangents_ptr) {
      vertex_input.tangents[i] = tangents_ptr[i];
    }
    if (binormals_ptr) {
      vertex_input.binormals[i] = binormals_ptr[i];
    }
    if (colors_ptr) {
      vertex_input.colors[i] = colors_ptr[i];
    }
    if (opacities_ptr) {
      vertex_input.opacities[i] = opacities_ptr[i];
    }
  }

  std::vector<uint32_t> out_indices;
  std::vector<uint32_t> out_point_indices;  // to reorder position data
  DefaultVertexOutput<DefaultPackedVertexData> vertex_output;

  BuildIndices<DefaultVertexInput<DefaultPackedVertexData>,
               DefaultVertexOutput<DefaultPackedVertexData>,
               DefaultPackedVertexData, DefaultPackedVertexDataHasher,
               DefaultPackedVertexDataEqual>(vertex_input, vertex_output,
                                             out_indices, out_point_indices);

  if (out_indices.size() != out_point_indices.size()) {
    PUSH_ERROR_AND_RETURN(
        "Internal error. out_indices.size != out_point_indices.");
  }

  DCOUT("faceVertexIndices.size : " << fvIndices.size());
  DCOUT("# of indices after the build: "
        << out_indices.size() << ", reduced "
        << (fvIndices.size() - out_indices.size()) << " indices.");

  if (mesh.is_triangulated()) {
    mesh.triangulatedFaceVertexIndices = out_indices;
  } else {
    mesh.usdFaceVertexIndices = out_indices;
  }

  //
  // Reorder 'vertex' varying attributes(points, jointIndices/jointWeights,
  // BlendShape points, ...)
  // TODO: Preserve input order as much as possible.
  //
  {
    uint32_t numPoints =
        *std::max_element(out_indices.begin(), out_indices.end()) + 1;
    {
      std::vector<value::float3> tmp_points(numPoints);
      // TODO: Use vertex_output[i].point_index?
      for (size_t i = 0; i < out_point_indices.size(); i++) {
        if (out_point_indices[i] >= mesh.points.size()) {
          PUSH_ERROR_AND_RETURN("Internal error. point index out-of-range.");
        }
        tmp_points[out_indices[i]] = mesh.points[out_point_indices[i]];
      }
      mesh.points.swap(tmp_points);
    }

    if (mesh.joint_and_weights.jointIndices.size()) {
      if (mesh.joint_and_weights.elementSize < 1) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. Invalid elementSize in mesh.joint_and_weights.");
      }
      uint32_t elementSize = uint32_t(mesh.joint_and_weights.elementSize);
      std::vector<int> tmp_indices(size_t(numPoints) * size_t(elementSize));
      std::vector<float> tmp_weights(size_t(numPoints) * size_t(elementSize));
      for (size_t i = 0; i < out_point_indices.size(); i++) {
        if ((elementSize * out_point_indices[i]) >=
            mesh.joint_and_weights.jointIndices.size()) {
          PUSH_ERROR_AND_RETURN(
              "Internal error. point index exceeds jointIndices.size.");
        }
        for (size_t k = 0; k < elementSize; k++) {
          tmp_indices[size_t(elementSize) * size_t(out_indices[i]) + k] =
              mesh.joint_and_weights
                  .jointIndices[size_t(elementSize) * size_t(out_point_indices[i]) + k];
        }

        if ((elementSize * out_point_indices[i]) >=
            mesh.joint_and_weights.jointWeights.size()) {
          PUSH_ERROR_AND_RETURN(
              "Internal error. point index exceeds jointWeights.size.");
        }

        for (size_t k = 0; k < elementSize; k++) {
          tmp_weights[size_t(elementSize) * size_t(out_indices[i]) + k] =
              mesh.joint_and_weights
                  .jointWeights[size_t(elementSize) * size_t(out_point_indices[i]) + k];
        }
      }
      mesh.joint_and_weights.jointIndices.swap(tmp_indices);
      mesh.joint_and_weights.jointWeights.swap(tmp_weights);
    }

    if (mesh.targets.size()) {
      // For BlendShape, reordering pointIndices, pointOffsets and normalOffsets is not enough.
      // Some points could be duplicated, so we need to find a mapping of org pointIdx -> pointIdx list in reordered points,
      // Then splat point attributes accordingly.

      // org pointIdx -> List of pointIdx in reordered points.
      std::unordered_map<uint32_t, std::vector<uint32_t>> pointIdxRemap;

      for (size_t i = 0; i < vertex_output.size(); i++) {
        pointIdxRemap[vertex_output.point_indices[i]].push_back(uint32_t(i));
      }

      for (auto &target : mesh.targets) {

        std::vector<value::float3> tmpPointOffsets;
        std::vector<value::float3> tmpNormalOffsets;
        std::vector<uint32_t> tmpPointIndices;

        for (size_t i = 0; i < target.second.pointIndices.size(); i++) {

          uint32_t orgPointIdx = target.second.pointIndices[i];
          if (!pointIdxRemap.count(orgPointIdx)) {
            PUSH_ERROR_AND_RETURN("Invalid pointIndices value.");
          }
          const std::vector<uint32_t> &dstPointIndices = pointIdxRemap.at(orgPointIdx);

          for (size_t k = 0; k < dstPointIndices.size(); k++) {
            if (target.second.pointOffsets.size()) {
              if (i >= target.second.pointOffsets.size()) {
                PUSH_ERROR_AND_RETURN("Invalid pointOffsets.size.");
              }
              tmpPointOffsets.push_back(target.second.pointOffsets[i]);
            }
            if (target.second.normalOffsets.size()) {
              if (i >= target.second.normalOffsets.size()) {
                PUSH_ERROR_AND_RETURN("Invalid normalOffsets.size.");
              }
              tmpNormalOffsets.push_back(target.second.normalOffsets[i]);
            }

            tmpPointIndices.push_back(dstPointIndices[k]);
          }
        }

        target.second.pointIndices.swap(tmpPointIndices);
        target.second.pointOffsets.swap(tmpPointOffsets);
        target.second.normalOffsets.swap(tmpNormalOffsets);

      }

      // TODO: Inbetween BlendShapes

    }

  }

  // Other 'facevarying' attributes are now 'vertex' variability
  if (normals_ptr) {
    mesh.normals.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.normals.data()),
        vertex_output.normals.size() * sizeof(value::float3));
    mesh.normals.variability = VertexVariability::Vertex;
  }

  if (texcoord0_ptr) {
    mesh.texcoords[0].set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.uv0s.data()),
        vertex_output.uv0s.size() * sizeof(value::float2));
    mesh.texcoords[0].variability = VertexVariability::Vertex;
  }

  if (texcoord1_ptr) {
    mesh.texcoords[1].set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.uv1s.data()),
        vertex_output.uv1s.size() * sizeof(value::float2));
    mesh.texcoords[1].variability = VertexVariability::Vertex;
  }

  if (tangents_ptr) {
    mesh.tangents.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.tangents.data()),
        vertex_output.tangents.size() * sizeof(value::float3));
    mesh.tangents.variability = VertexVariability::Vertex;
  }

  if (binormals_ptr) {
    mesh.binormals.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.binormals.data()),
        vertex_output.binormals.size() * sizeof(value::float3));
    mesh.binormals.variability = VertexVariability::Vertex;
  }

  if (colors_ptr) {
    mesh.vertex_colors.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.colors.data()),
        vertex_output.colors.size() * sizeof(value::float3));
    mesh.vertex_colors.variability = VertexVariability::Vertex;
  }

  if (opacities_ptr) {
    mesh.vertex_opacities.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.opacities.data()),
        vertex_output.opacities.size() * sizeof(float));
    mesh.vertex_opacities.variability = VertexVariability::Vertex;
  }

  return true;
}